

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

void __thiscall Text::createTexture(Text *this)

{
  size_t sVar1;
  size_t sVar2;
  PFNGLTEXIMAGE2DPROC p_Var3;
  bool bVar4;
  size_type sVar5;
  size_type sVar6;
  void *pvVar7;
  reference pvVar8;
  size_type local_38;
  size_t i;
  uint8_t *rgbData;
  size_t newSize;
  size_t currentSize;
  Text *pTStack_10;
  GLuint textureId;
  Text *this_local;
  
  pTStack_10 = this;
  (*glad_glGenTextures)(1,(GLuint *)((long)&currentSize + 4));
  (*glad_glBindTexture)(0xde1,currentSize._4_4_);
  (*glad_glTexParameteri)(0xde1,0x2802,0x2900);
  (*glad_glTexParameteri)(0xde1,0x2803,0x2900);
  (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
  (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
  bVar4 = operator==(&this->_color,&FONT_COLOR_WHITE);
  p_Var3 = glad_glTexImage2D;
  if (bVar4) {
    sVar1 = (this->_font).tex_width;
    sVar2 = (this->_font).tex_height;
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&(this->_font).tex_data,0);
    (*p_Var3)(0xde1,0,0x1906,(GLsizei)sVar1,(GLsizei)sVar2,0,0x1906,0x1401,pvVar8);
  }
  else {
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (&(this->_font).tex_data);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (&(this->_font).tex_data);
    pvVar7 = operator_new__(sVar6 << 2);
    for (local_38 = 0; local_38 < sVar5; local_38 = local_38 + 1) {
      *(uint8_t *)((long)pvVar7 + local_38 * 4) = (this->_color).r;
      *(uint8_t *)((long)pvVar7 + local_38 * 4 + 1) = (this->_color).g;
      *(uint8_t *)((long)pvVar7 + local_38 * 4 + 2) = (this->_color).b;
      pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&(this->_font).tex_data,local_38);
      *(value_type *)((long)pvVar7 + local_38 * 4 + 3) = *pvVar8;
    }
    (*glad_glTexImage2D)
              (0xde1,0,0x1908,(GLsizei)(this->_font).tex_width,(GLsizei)(this->_font).tex_height,0,
               0x1908,0x1401,pvVar7);
  }
  Texture::loadExisting
            (&this->_texture,(GLsizei)(this->_font).tex_width,(GLsizei)(this->_font).tex_height,
             currentSize._4_4_);
  return;
}

Assistant:

void Text::createTexture() {
    GLuint textureId;
    glGenTextures(1, &textureId);
    glBindTexture(GL_TEXTURE_2D, textureId);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);

    // Optimization for white text
    if (_color == FONT_COLOR_WHITE) {
        // Use 8bit alpha only texture to save memory
        glTexImage2D(GL_TEXTURE_2D, 0, GL_ALPHA, (GLsizei)_font.tex_width, (GLsizei)_font.tex_height, 0, GL_ALPHA, GL_UNSIGNED_BYTE, &_font.tex_data[0]);
    } else {
        // Convert the texture data to 32bit RGBA
        size_t currentSize = _font.tex_data.size();
        size_t newSize = _font.tex_data.size() * 4;
        uint8_t* rgbData = new uint8_t[newSize];
        for (size_t i = 0; i < currentSize; i+=1) {
            rgbData[(i*4)]   = _color.r;
            rgbData[(i*4)+1] = _color.g;
            rgbData[(i*4)+2] = _color.b;
            rgbData[(i*4)+3] = _font.tex_data[i];
        }
        glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, (GLsizei)_font.tex_width, (GLsizei)_font.tex_height, 0, GL_RGBA, GL_UNSIGNED_BYTE, rgbData);
    }

    _texture.loadExisting((GLsizei)_font.tex_width, (GLsizei)_font.tex_height, textureId);
}